

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int util_save_ticket_cb(ptls_save_ticket_t *_self,ptls_t *tls,ptls_iovec_t src)

{
  FILE *__stream;
  int iVar1;
  FILE *__s;
  int *piVar2;
  char *pcVar3;
  
  __s = fopen((char *)(_self + 1),"wb");
  __stream = _stderr;
  if (__s == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"failed to open file:%s:%s\n",_self + 1,pcVar3);
    iVar1 = 0x203;
  }
  else {
    fwrite(src.base,1,src.len,__s);
    fclose(__s);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int util_save_ticket_cb(ptls_save_ticket_t *_self, ptls_t *tls, ptls_iovec_t src)
{
    struct st_util_save_ticket_t *self = (void *)_self;
    FILE *fp;

    if ((fp = fopen(self->fn, "wb")) == NULL) {
        fprintf(stderr, "failed to open file:%s:%s\n", self->fn, strerror(errno));
        return PTLS_ERROR_LIBRARY;
    }
    fwrite(src.base, 1, src.len, fp);
    fclose(fp);

    return 0;
}